

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

void ON_Mesh_SetClosedHelper
               (bool bClosedOnly,ON_Mesh *mesh,char *m_mesh_is_manifold,char *m_mesh_is_oriented)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  char cVar4;
  uint *puVar5;
  uint *memblock;
  ON_MeshFace *pOVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  char cVar18;
  char cVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  uint Vidbuffer [256];
  uint local_438 [258];
  
  uVar13 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar16 = (mesh->m_F).m_count;
  uVar9 = (ulong)uVar16;
  if (uVar13 < 3 || uVar9 == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0xe8b,"","Mesh is not valid.");
  }
  else {
    if ((!bClosedOnly) || (3 < uVar16 && 3 < uVar13)) {
      uVar12 = 0;
      puVar5 = (uint *)0x0;
      if (uVar13 < 0x101) {
        puVar5 = local_438;
      }
      puVar5 = ON_Mesh::GetVertexLocationIds(mesh,1,puVar5,(uint *)0x0);
      if (puVar5 == (uint *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0xe9d,"","Mesh has corrupt vertex information.");
      }
      else {
        memblock = (uint *)onmalloc((ulong)(uVar16 * 4) * 0xc);
        pOVar6 = (mesh->m_F).m_a;
        uVar20 = 0;
        do {
          uVar10 = puVar5[pOVar6->vi[0]];
          uVar14 = puVar5[pOVar6->vi[1]];
          uVar7 = uVar20;
          uVar13 = uVar12;
          if (uVar10 == uVar14) break;
          uVar13 = uVar14;
          if (uVar14 < uVar10) {
            uVar13 = uVar10;
          }
          uVar1 = uVar10;
          if (uVar14 <= uVar10) {
            uVar1 = uVar14;
          }
          uVar11 = (ulong)uVar12;
          memblock[uVar11 * 3] = uVar1;
          memblock[uVar11 * 3 + 1] = uVar13;
          memblock[uVar11 * 3 + 2] = (uint)(uVar14 <= uVar10 && uVar10 != uVar14);
          uVar10 = puVar5[pOVar6->vi[2]];
          uVar13 = uVar12 + 1;
          if (uVar14 == uVar10) break;
          uVar1 = uVar10;
          if (uVar10 < uVar14) {
            uVar1 = uVar14;
          }
          uVar2 = uVar14;
          if (uVar10 <= uVar14) {
            uVar2 = uVar10;
          }
          uVar13 = uVar12 + 2;
          uVar11 = (ulong)(uVar12 + 1);
          memblock[uVar11 * 3] = uVar2;
          memblock[uVar11 * 3 + 1] = uVar1;
          memblock[uVar11 * 3 + 2] = (uint)(uVar10 <= uVar14 && uVar14 != uVar10);
          if (pOVar6->vi[2] != pOVar6->vi[3]) {
            uVar14 = puVar5[pOVar6->vi[3]];
            if (uVar10 == uVar14) break;
            uVar1 = uVar14;
            if (uVar14 < uVar10) {
              uVar1 = uVar10;
            }
            uVar2 = uVar10;
            if (uVar14 <= uVar10) {
              uVar2 = uVar14;
            }
            uVar11 = (ulong)uVar13;
            memblock[uVar11 * 3] = uVar2;
            memblock[uVar11 * 3 + 1] = uVar1;
            memblock[uVar11 * 3 + 2] = (uint)(uVar14 <= uVar10 && uVar10 != uVar14);
            uVar13 = uVar12 + 3;
            uVar10 = uVar14;
          }
          uVar14 = puVar5[pOVar6->vi[0]];
          bVar21 = uVar14 <= uVar10;
          bVar22 = uVar10 == uVar14;
          if (bVar22) break;
          uVar1 = uVar14;
          if (bVar21 && !bVar22) {
            uVar1 = uVar10;
          }
          if (!bVar21) {
            uVar14 = uVar10;
          }
          uVar7 = (ulong)uVar13;
          uVar12 = uVar13 + 1;
          memblock[uVar7 * 3] = uVar14;
          memblock[uVar7 * 3 + 1] = uVar1;
          memblock[uVar7 * 3 + 2] = (uint)(bVar21 && !bVar22);
          uVar20 = uVar20 + 1;
          pOVar6 = pOVar6 + 1;
          uVar7 = uVar9;
          uVar13 = uVar12;
        } while (uVar9 != uVar20);
        if (puVar5 != local_438) {
          onfree(puVar5);
        }
        if (((uint)uVar7 == uVar16) && (2 < uVar13)) {
          uVar7 = (ulong)uVar13;
          uVar20 = (ulong)(uVar13 >> 1);
          uVar9 = uVar7 - 1;
          do {
            if (uVar20 == 0) {
              uVar12 = memblock[uVar9 * 3];
              uVar10 = memblock[uVar9 * 3 + 1];
              uVar14 = memblock[uVar9 * 3 + 2];
              *(undefined8 *)(memblock + uVar9 * 3) = *(undefined8 *)memblock;
              memblock[uVar9 * 3 + 2] = memblock[2];
              uVar9 = uVar9 - 1;
              if (uVar9 == 0) goto LAB_004ffcb0;
              uVar11 = 0;
              uVar20 = uVar11;
            }
            else {
              uVar11 = uVar20 - 1;
              uVar12 = memblock[uVar11 * 3];
              uVar10 = memblock[uVar11 * 3 + 1];
              uVar14 = memblock[uVar11 * 3 + 2];
              uVar20 = uVar11;
            }
            while (uVar8 = uVar11 * 2, uVar8 < uVar9) {
              uVar15 = uVar8 | 1;
              if (uVar15 < uVar9) {
                uVar8 = uVar8 + 2;
                if ((memblock[uVar15 * 3] < memblock[uVar8 * 3]) ||
                   ((memblock[uVar15 * 3] == memblock[uVar8 * 3] &&
                    ((memblock[uVar15 * 3 + 1] < memblock[uVar8 * 3 + 1] ||
                     ((memblock[uVar15 * 3 + 1] == memblock[uVar8 * 3 + 1] &&
                      (memblock[uVar15 * 3 + 2] < memblock[uVar8 * 3 + 2])))))))) {
                  uVar15 = uVar8;
                }
              }
              puVar5 = memblock + uVar15 * 3;
              if ((memblock[uVar15 * 3] <= uVar12) &&
                 ((uVar12 != memblock[uVar15 * 3] ||
                  ((puVar5[1] <= uVar10 && ((uVar10 != puVar5[1] || (puVar5[2] <= uVar14))))))))
              break;
              memblock[uVar11 * 3 + 2] = puVar5[2];
              *(undefined8 *)(memblock + uVar11 * 3) = *(undefined8 *)puVar5;
              uVar11 = uVar15;
            }
            memblock[uVar11 * 3] = uVar12;
            memblock[uVar11 * 3 + 1] = uVar10;
            memblock[uVar11 * 3 + 2] = uVar14;
          } while( true );
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0xef1,"","Mesh is corrupt or collapsed");
      }
      cVar19 = '\x02';
      bClosedOnly = false;
      cVar18 = '\x02';
      goto LAB_004ffc5f;
    }
    bClosedOnly = true;
  }
  cVar19 = '\x02';
  cVar18 = '\x02';
  goto LAB_004ffc5f;
LAB_004ffcb0:
  *memblock = uVar12;
  memblock[1] = uVar10;
  memblock[2] = uVar14;
  bVar21 = 5 < uVar13 && 3 < uVar16;
  if ((!bClosedOnly) || (bVar21)) {
    cVar18 = '\x01';
    uVar9 = 0;
    bVar3 = 0;
    cVar19 = cVar18;
    while( true ) {
      do {
        uVar16 = (uint)uVar9;
        uVar20 = (ulong)uVar13;
        if (uVar13 < uVar16) {
          uVar20 = uVar9 & 0xffffffff;
        }
        uVar11 = uVar9 & 0xffffffff;
        puVar5 = memblock + uVar11 * 3 + 5;
        uVar12 = uVar16 + 3;
        lVar17 = 0;
        while( true ) {
          if ((uVar11 - uVar20) + lVar17 == 0) goto LAB_004ffce4;
          if (uVar7 <= uVar11 + lVar17 + 1) {
            uVar12 = uVar16 + 1;
            if (uVar16 + 1 < uVar13) {
              uVar12 = uVar13;
            }
            goto LAB_004ffe8c;
          }
          uVar10 = puVar5[-5];
          if ((uVar10 == puVar5[-2]) && (uVar14 = puVar5[-4], uVar14 == puVar5[-1])) break;
          if ((bool)(cVar18 == '\x02' & bVar3)) {
            uVar12 = uVar16 + (int)lVar17 + 1;
            goto LAB_004ffe7c;
          }
          lVar17 = lVar17 + 1;
          puVar5 = puVar5 + 3;
          uVar12 = uVar12 + 1;
          bVar21 = false;
          if (bClosedOnly) {
            bClosedOnly = true;
            uVar12 = uVar16 + (int)lVar17;
            goto LAB_004ffe8c;
          }
        }
        if (puVar5[-3] == *puVar5) {
          cVar18 = '\x02';
        }
        uVar9 = uVar11 + lVar17 + 2;
      } while (((uVar13 <= (uint)uVar9) || (uVar10 != memblock[(uVar9 & 0xffffffff) * 3])) ||
              (uVar14 != memblock[(uVar9 & 0xffffffff) * 3 + 1]));
      if (!bVar21) break;
      uVar9 = uVar11 + lVar17 + 3;
      if ((uint)uVar9 < uVar13) {
        uVar9 = uVar9 & 0xffffffff;
        puVar5 = memblock + (ulong)uVar12 * 3 + 1;
        do {
          if ((uVar10 != puVar5[-1]) || (uVar14 != *puVar5)) goto LAB_004ffe60;
          uVar9 = uVar9 + 1;
          puVar5 = puVar5 + 3;
        } while (uVar9 < uVar7);
        uVar9 = (ulong)uVar13;
      }
LAB_004ffe60:
      bVar3 = 1;
      bVar21 = true;
      cVar18 = '\x02';
      cVar19 = cVar18;
    }
    uVar12 = uVar16 + (int)lVar17 + 2;
LAB_004ffe7c:
    cVar18 = '\x02';
    bClosedOnly = false;
    cVar19 = '\x02';
LAB_004ffe8c:
    bClosedOnly = (bool)(bClosedOnly & uVar12 < uVar13);
    onfree(memblock);
  }
  else {
    cVar18 = '\x01';
    uVar20 = 0;
    cVar19 = '\x01';
LAB_004ffce4:
    bClosedOnly = bClosedOnly && (uint)uVar20 < uVar13;
    onfree(memblock);
    cVar4 = '\x01';
    if (bVar21) goto LAB_004ffc69;
  }
LAB_004ffc5f:
  mesh->m_mesh_is_solid = '\x03';
  cVar4 = '\x02';
LAB_004ffc69:
  if (mesh->m_mesh_is_closed != cVar4) {
    mesh->m_mesh_is_closed = cVar4;
    mesh->m_mesh_is_manifold = '\0';
    mesh->m_mesh_is_oriented = '\0';
  }
  if (bClosedOnly == false) {
    cVar4 = '\x02';
    if (cVar19 != '\x02') {
      cVar4 = cVar18;
    }
    *m_mesh_is_manifold = cVar19;
    *m_mesh_is_oriented = cVar4;
  }
  return;
}

Assistant:

static void ON_Mesh_SetClosedHelper( 
          bool bClosedOnly,
          const ON_Mesh& mesh,
          const char& m_mesh_is_manifold,
          const char& m_mesh_is_oriented
          )
{
  // thread safe lazy evaluation for mesh's m_mesh_is_... flags
  // Sets: m_mesh_is_closed.
  //       If bClosedOnly is false, also sets m_mesh_is_manifold and m_mesh_is_oriented
  int is_closed = 0;
  char is_manifold = 2;
  char is_oriented = 2;
  for (;;)
  {
    const unsigned int Vcount = mesh.m_V.UnsignedCount();
    const unsigned int Fcount = mesh.m_F.UnsignedCount();
    if ( Vcount < 3 || Fcount < 1 )
    {
      ON_ERROR("Mesh is not valid.");
      break;
    }
    if ( bClosedOnly && (Vcount < 4 || Fcount < 4) )
    {
      // not closed - don't waste any more time.
      break;
    }

    unsigned int i, j;
    unsigned int Vidbuffer[256];
    unsigned int* Vid = mesh.GetVertexLocationIds(
                     1,
                     (Vcount*sizeof(*Vid) <= sizeof(Vidbuffer) ? &Vidbuffer[0] : nullptr),
                     nullptr // unwanted Vindex[] values
                    );
    if ( 0 == Vid )
    {
      ON_ERROR("Mesh has corrupt vertex information.");
      bClosedOnly = false;
      break;
    }

    // build an edge list where the "vertex" indices identify unique 3d locations
    ON_3udex* E_list = (ON_3udex*)onmalloc(4 * Fcount*sizeof(E_list[0]));
    ON_3udex E;
    unsigned int Vid0;
    const int* fvi;
    unsigned int E_count = 0;
    const ON_MeshFace* F = mesh.m_F.Array();
    for ( j = 0; j < Fcount; j++ )
    {
      fvi = F[j].vi;
      E.i = Vid[fvi[0]];
      Vid0 = E.j = Vid[fvi[1]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;

      E.i = Vid0;
      Vid0 = E.j = Vid[fvi[2]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;

      if ( fvi[2] != fvi[3] )
      {
        // quad
        E.i = Vid0;
        Vid0 = E.j = Vid[fvi[3]];
        if ( E.i == E.j )
          break;
        if ( E.i > E.j )
        {
          i = E.i; E.i = E.j; E.j = i;
          E.k = 1;
        }
        else
        {
          E.k = 0;
        }
        E_list[E_count++] = E;
      }

      E.i = Vid0;
      E.j = Vid[fvi[0]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;
    }
    if ( Vid != &Vidbuffer[0] )
      onfree(Vid);

    if ( E_count < 3 || j != Fcount )
    {
      ON_ERROR("Mesh is corrupt or collapsed");
      bClosedOnly = false;
      break;
    }

    // sort the the edges
    ON_hsort_3udex(E_list,E_count);

    // Look for duplicate edges.  If we find an edge with no duplicate,
    // then the mesh is open.  It is possible that degenerate meshes,
    // like a flattened box, will be flagged as closed.
    is_closed = (Fcount >= 4 && E_count >= 6) ? 1 : 0;
    is_oriented = 1;
    is_manifold = 1;
    i = 0;
    if ( !bClosedOnly || 1 == is_closed ) for ( i = 0; i < E_count; /*empty iterator*/ )
    {
      E = E_list[i];
      if ( ++i >= E_count )
      {
        // boundary edge (and the last edge in our list)
        is_closed = 0;
        break;
      }

      if ( E.i != E_list[i].i || E.j != E_list[i].j )
      {
        // boundary edge
        is_closed = 0;
        if ( 2 == is_oriented && 2 == is_manifold )
        {
          bClosedOnly = false;
          break;
        }
        if ( bClosedOnly )
          break; // don't spend time with further testing
        continue;
      }

      if ( E.k == E_list[i].k )
      {
        // opposite face normals along this edge - mesh is not oriented
        is_oriented = 2; 
      }

      if ( ++i >= E_count || E.i != E_list[i].i || E.j != E_list[i].j )
      {
        // two faces share this edge
        continue;
      }

      // three or more faces share this edge - mesh is not oriented manifold
      is_oriented = 2; 
      is_manifold = 2; 
      if ( 0 == is_closed )
      {
        bClosedOnly = false;
        break;
      }

      // Check for more faces sharing this edge.
      for ( i++; i < E_count; i++ )
      {
        if ( E.i != E_list[i].i || E.j != E_list[i].j )
        {
          // the edges E and Eid_list[i] are in different locations
          break;
        }
      }
    }
    if (E_count > 0 && i >= E_count)
    {
      // is_manifold and is_oriented are set correctly
      bClosedOnly = false;
    }

    onfree(E_list);

    break;
  }

  const_cast<ON_Mesh&>(mesh).SetClosed(is_closed);
  if ( !bClosedOnly )
  {
    // is_manifold and is_oriented are set correctly
    if ( 2 == is_manifold )
      is_oriented = 2;
    const_cast<char&>(m_mesh_is_manifold) = is_manifold;
    const_cast<char&>(m_mesh_is_oriented) = is_oriented;
  }
}